

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O2

void chrono::XdirToDxDyDz<double>
               (ChVector<double> *Vxdir,ChVector<double> *Vsingular,ChVector<double> *Vx,
               ChVector<double> *Vy,ChVector<double> *Vz)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 local_68 [16];
  double local_58;
  ChVector<double> local_48;
  
  if ((((Vxdir->m_data[0] != 0.0) || (NAN(Vxdir->m_data[0]))) || (Vxdir->m_data[1] != 0.0)) ||
     (((NAN(Vxdir->m_data[1]) || (Vxdir->m_data[2] != 0.0)) || (NAN(Vxdir->m_data[2]))))) {
    Vnorm<double>((ChVector<double> *)local_68,Vxdir);
    if ((ChVector<double> *)local_68 != Vx) {
      Vx->m_data[0] = (double)local_68._0_8_;
      Vx->m_data[1] = (double)local_68._8_8_;
      Vx->m_data[2] = local_58;
    }
  }
  else {
    Vx->m_data[0] = 1.0;
    Vx->m_data[1] = 0.0;
    Vx->m_data[2] = 0.0;
  }
  Vcross<double,double>(Vx,Vsingular);
  if ((ChVector<double> *)local_68 != Vz) {
    Vz->m_data[0] = (double)local_68._0_8_;
    Vz->m_data[1] = (double)local_68._8_8_;
    Vz->m_data[2] = local_58;
  }
  dVar6 = ChVector<double>::Length(Vz);
  if (dVar6 < 0.0001) {
    local_58 = 0.0;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = Vsingular->m_data[2];
    auVar5._8_8_ = 0x7fffffffffffffff;
    auVar5._0_8_ = 0x7fffffffffffffff;
    auVar5 = vandpd_avx512vl(auVar7,auVar5);
    if (auVar5._0_8_ < 0.9) {
      local_58 = 1.0;
    }
    local_68 = ZEXT816(0);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = Vsingular->m_data[1];
    auVar2._8_8_ = 0x7fffffffffffffff;
    auVar2._0_8_ = 0x7fffffffffffffff;
    auVar5 = vandpd_avx512vl(auVar8,auVar2);
    if (auVar5._0_8_ < 0.9) {
      local_68 = vmovhpd_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
      local_58 = 0.0;
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = Vsingular->m_data[0];
    auVar3._8_8_ = 0x7fffffffffffffff;
    auVar3._0_8_ = 0x7fffffffffffffff;
    auVar5 = vandpd_avx512vl(auVar9,auVar3);
    if (auVar5._0_8_ < 0.9) {
      local_68 = ZEXT816(0x3ff0000000000000);
      local_58 = 0.0;
    }
    Vcross<double,double>(Vx,(ChVector<double> *)local_68);
    if (&local_48 != Vz) {
      Vz->m_data[0] = local_48.m_data[0];
      Vz->m_data[1] = local_48.m_data[1];
      Vz->m_data[2] = local_48.m_data[2];
    }
    dVar6 = ChVector<double>::Length(Vz);
  }
  dVar6 = 1.0 / dVar6;
  dVar1 = Vz->m_data[2];
  dVar4 = Vz->m_data[1];
  Vz->m_data[0] = dVar6 * Vz->m_data[0];
  Vz->m_data[1] = dVar6 * dVar4;
  Vz->m_data[2] = dVar6 * dVar1;
  Vcross<double,double>(Vz,Vx);
  if ((ChVector<double> *)local_68 != Vy) {
    Vy->m_data[0] = (double)local_68._0_8_;
    Vy->m_data[1] = (double)local_68._8_8_;
    Vy->m_data[2] = local_58;
  }
  return;
}

Assistant:

void XdirToDxDyDz(const ChVector<RealA>& Vxdir,
                  const ChVector<RealA>& Vsingular,
                  ChVector<RealA>& Vx,
                  ChVector<RealA>& Vy,
                  ChVector<RealA>& Vz) {
    ChVector<RealA> mVnull(0, 0, 0);
    double zlen;

    if (Vequal(Vxdir, mVnull))
        Vx = ChVector<RealA>(1, 0, 0);
    else
        Vx = Vnorm(Vxdir);

    Vz = Vcross(Vx, Vsingular);
    zlen = Vlength(Vz);

    // If close to singularity, change reference vector
    if (zlen < 0.0001) {
        ChVector<> mVsingular;
        if (std::abs(Vsingular.z()) < 0.9)
            mVsingular = ChVector<RealA>(0, 0, 1);
        if (std::abs(Vsingular.y()) < 0.9)
            mVsingular = ChVector<RealA>(0, 1, 0);
        if (std::abs(Vsingular.x()) < 0.9)
            mVsingular = ChVector<RealA>(1, 0, 0);
        Vz = Vcross(Vx, mVsingular);
        zlen = Vlength(Vz);  // now should be nonzero length.
    }

    // normalize Vz
    Vz = Vmul(Vz, 1.0 / zlen);
    // compute Vy
    Vy = Vcross(Vz, Vx);
}